

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_calculation.cc
# Opt level: O0

void __thiscall
sptk::HistogramCalculation::HistogramCalculation
          (HistogramCalculation *this,int num_bin,double lower_bound,double upper_bound)

{
  double upper_bound_local;
  double lower_bound_local;
  int num_bin_local;
  HistogramCalculation *this_local;
  
  this->_vptr_HistogramCalculation = (_func_int **)&PTR__HistogramCalculation_0012acc8;
  this->num_bin_ = num_bin;
  this->lower_bound_ = lower_bound;
  this->upper_bound_ = upper_bound;
  this->bin_width_ = (this->upper_bound_ - this->lower_bound_) / (double)this->num_bin_;
  this->is_valid_ = true;
  if ((this->num_bin_ < 1) || (this->upper_bound_ <= this->lower_bound_)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

HistogramCalculation::HistogramCalculation(int num_bin, double lower_bound,
                                           double upper_bound)
    : num_bin_(num_bin),
      lower_bound_(lower_bound),
      upper_bound_(upper_bound),
      bin_width_((upper_bound_ - lower_bound_) / num_bin_),
      is_valid_(true) {
  if (num_bin_ <= 0 || upper_bound_ <= lower_bound_) {
    is_valid_ = false;
    return;
  }
}